

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar6;
  options_description *poVar7;
  const_iterator cVar8;
  ostream *poVar9;
  any *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long *plVar12;
  long *plVar13;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  path dot_file_path;
  path input_file_path;
  path image_file_path;
  string file_data;
  options_description hidden;
  string dot_cmd;
  options_description visible;
  options_description cmdline_options;
  fsm_def sm;
  options_description config_file_options;
  positional_options_description p;
  options_description config;
  options_description basic;
  variables_map vm;
  key_type local_7c0;
  long *local_7a0;
  long local_798;
  long local_790 [2];
  path local_780;
  long *local_760 [2];
  long local_750 [2];
  long *local_740;
  long local_738;
  long local_730;
  long lStack_728;
  long *local_720 [2];
  long local_710 [2];
  long *local_700 [2];
  long local_6f0 [2];
  long *local_6e0 [2];
  long local_6d0 [2];
  char **local_6c0;
  long *local_6b8;
  long local_6b0;
  long local_6a8;
  long lStack_6a0;
  long *local_698;
  long local_690;
  long local_688;
  long lStack_680;
  undefined1 *local_678;
  undefined8 local_670;
  undefined1 local_668;
  undefined7 uStack_667;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_630 [24];
  void *local_618;
  undefined4 local_610;
  undefined8 local_608;
  undefined4 local_600;
  long local_5f8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_5f0 [24];
  undefined1 local_5d8 [8];
  pointer local_5d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8 [2];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_5a8 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_588 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  ios_base local_4e0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_3b0 [24];
  void *local_398;
  undefined4 local_390;
  undefined8 local_388;
  undefined4 local_380;
  long local_378;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_370 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_330 [24];
  void *local_318;
  undefined4 local_310;
  undefined8 local_308;
  undefined4 local_300;
  long local_2f8;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_2f0 [24];
  fsm_def local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_260 [24];
  void *local_248;
  undefined4 local_240;
  undefined8 local_238;
  undefined4 local_230;
  long local_228;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_220 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  long *local_1f0;
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1a8 [24];
  void *local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined4 local_178;
  long local_170;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_168 [24];
  long *local_150 [2];
  long local_140 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_128 [24];
  void *local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  long local_f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_e8 [24];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_6c0 = argv;
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  local_678 = &local_668;
  local_670 = 0;
  local_668 = 0;
  local_5d8 = (undefined1  [8])local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Basic options","");
  uVar2 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar16 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  boost::program_options::options_description::options_description
            ((options_description *)local_150,(string *)local_5d8,
             (uint)boost::program_options::options_description::m_default_line_length,uVar16);
  if (local_5d8 != (undefined1  [8])local_5c8) {
    operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
  }
  local_5d8 = (undefined1  [8])boost::program_options::options_description::add_options();
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_5d8,"version,v");
  boost::program_options::options_description_easy_init::operator()(pcVar4,"help,h");
  local_5d8 = (undefined1  [8])local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Configuration","");
  boost::program_options::options_description::options_description
            ((options_description *)local_1d0,(string *)local_5d8,uVar2,uVar16);
  if (local_5d8 != (undefined1  [8])local_5c8) {
    operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
  }
  local_2d8.transitions.super__Vector_base<transition,_std::allocator<transition>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_5d8 = (undefined1  [8])local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_5d8);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_2d8,(value_semantic *)"file,f",(char *)ptVar5);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,"dot-stdout");
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"dot","");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,&local_658);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"dot-path,dot",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,&local_358);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"output-dir,dir",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,&local_288);
  pcVar4 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar4,(value_semantic *)"output,o",(char *)ptVar5);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"png","");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,&local_3d8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar4,(value_semantic *)"image-ext,ext",(char *)ptVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if (local_5d8 != (undefined1  [8])local_5c8) {
    operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
  }
  local_5d8 = (undefined1  [8])local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Hidden options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_658,(string *)local_5d8,uVar2,uVar16);
  if (local_5d8 != (undefined1  [8])local_5c8) {
    operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
  }
  local_5d8 = (undefined1  [8])boost::program_options::options_description::add_options();
  ptVar6 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (local_5d8,(value_semantic *)"dot-params",(char *)ptVar6);
  boost::program_options::options_description::options_description
            ((options_description *)&local_358,uVar2,uVar16);
  poVar7 = (options_description *)
           boost::program_options::options_description::add((options_description *)&local_358);
  poVar7 = (options_description *)boost::program_options::options_description::add(poVar7);
  boost::program_options::options_description::add(poVar7);
  boost::program_options::options_description::options_description
            ((options_description *)&local_288,uVar2,uVar16);
  poVar7 = (options_description *)
           boost::program_options::options_description::add((options_description *)&local_288);
  boost::program_options::options_description::add(poVar7);
  local_5d8 = (undefined1  [8])local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_3d8,(string *)local_5d8,uVar2,uVar16);
  if (local_5d8 != (undefined1  [8])local_5c8) {
    operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
  }
  poVar7 = (options_description *)
           boost::program_options::options_description::add((options_description *)&local_3d8);
  boost::program_options::options_description::add(poVar7);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_208);
  boost::program_options::positional_options_description::add((char *)&local_208,0x112247);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_5d8,argc,local_6c0);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_5d8)
  ;
  local_568 = &local_358;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_5d8);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&local_2d8,(basic_command_line_parser<char> *)local_5d8);
  boost::program_options::store((basic_parsed_options *)&local_2d8,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&local_2d8);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_588);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_5a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5d8);
  boost::program_options::notify((variables_map *)local_d0);
  boost::program_options::notify((variables_map *)local_d0);
  local_5d8 = (undefined1  [8])local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"help","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_5d8);
  if (local_5d8 != (undefined1  [8])local_5c8) {
    operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
  }
  if (cVar8._M_node == &local_b8) {
    local_5d8 = (undefined1  [8])local_5c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"version","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_5d8);
    if (local_5d8 != (undefined1  [8])local_5c8) {
      operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
    }
    if (cVar8._M_node == &local_b8) {
      local_5d8 = (undefined1  [8])local_5c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"dot-params","");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::find(local_c0,(key_type *)local_5d8);
      if (local_5d8 != (undefined1  [8])local_5c8) {
        operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
      }
      local_5d8 = (undefined1  [8])local_5c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"file","");
      paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_d0);
      pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
      local_780.m_pathname._M_dataplus._M_p = (pointer)&local_780.m_pathname.field_2;
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_780,pcVar1,pcVar1 + pbVar11->_M_string_length);
      if (local_5d8 != (undefined1  [8])local_5c8) {
        operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
      }
      fsm_from_file(&local_2d8,&local_780);
      local_5d8 = (undefined1  [8])local_5c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"gv","");
      plVar12 = (long *)boost::filesystem::path::replace_extension(&local_780);
      local_7a0 = local_790;
      std::__cxx11::string::_M_construct<char*>((string *)&local_7a0,*plVar12,plVar12[1] + *plVar12)
      ;
      if (local_5d8 != (undefined1  [8])local_5c8) {
        operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
      }
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"image-ext","");
      paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_d0);
      pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      local_5d8 = (undefined1  [8])local_5c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_5d8,pcVar1,pcVar1 + pbVar11->_M_string_length);
      plVar12 = (long *)boost::filesystem::path::replace_extension(&local_780);
      local_720[0] = local_710;
      std::__cxx11::string::_M_construct<char*>((string *)local_720,*plVar12,plVar12[1] + *plVar12);
      if (local_5d8 != (undefined1  [8])local_5c8) {
        operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Writing dot file to: \'",0x16);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_7a0,local_798);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::ofstream::ofstream(local_5d8,(string *)&local_7a0,_S_out);
      poVar9 = operator<<((ostream *)local_5d8,&local_2d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      local_5d8 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_5d8 + *(long *)(_VTT + -0x18)) = _memcpy;
      std::filebuf::~filebuf((filebuf *)&local_5d0);
      std::ios_base::~ios_base(local_4e0);
      local_6e0[0] = local_6d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6e0,"dot-path","");
      paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_d0);
      pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
      pcVar1 = (pbVar11->_M_dataplus)._M_p;
      local_760[0] = local_750;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_760,pcVar1,pcVar1 + pbVar11->_M_string_length);
      std::__cxx11::string::append((char *)local_760);
      local_700[0] = local_6f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"image-ext","");
      paVar10 = (any *)boost::program_options::abstract_variables_map::operator[]
                                 ((string *)local_d0);
      pbVar11 = boost::any_cast<std::__cxx11::string_const&>(paVar10);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)local_760,(ulong)(pbVar11->_M_dataplus)._M_p);
      local_740 = &local_730;
      plVar13 = plVar12 + 2;
      if ((long *)*plVar12 == plVar13) {
        local_730 = *plVar13;
        lStack_728 = plVar12[3];
      }
      else {
        local_730 = *plVar13;
        local_740 = (long *)*plVar12;
      }
      local_738 = plVar12[1];
      *plVar12 = (long)plVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_740);
      plVar13 = plVar12 + 2;
      if ((long *)*plVar12 == plVar13) {
        local_6a8 = *plVar13;
        lStack_6a0 = plVar12[3];
        local_6b8 = &local_6a8;
      }
      else {
        local_6a8 = *plVar13;
        local_6b8 = (long *)*plVar12;
      }
      local_6b0 = plVar12[1];
      *plVar12 = (long)plVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_6b8,(ulong)local_7a0);
      plVar13 = plVar12 + 2;
      if ((long *)*plVar12 == plVar13) {
        local_688 = *plVar13;
        lStack_680 = plVar12[3];
        local_698 = &local_688;
      }
      else {
        local_688 = *plVar13;
        local_698 = (long *)*plVar12;
      }
      local_690 = plVar12[1];
      *plVar12 = (long)plVar13;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_698);
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      psVar14 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_7c0.field_2._M_allocated_capacity = *psVar14;
        local_7c0.field_2._8_8_ = plVar12[3];
      }
      else {
        local_7c0.field_2._M_allocated_capacity = *psVar14;
        local_7c0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_7c0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_7c0,(ulong)local_720[0]);
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 == paVar15) {
        local_5c8[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_5c8[0]._8_8_ = plVar12[3];
        local_5d8 = (undefined1  [8])local_5c8;
      }
      else {
        local_5c8[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_5d8 = (undefined1  [8])*plVar12;
      }
      local_5d0 = (pointer)plVar12[1];
      *plVar12 = (long)paVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
      }
      if (local_698 != &local_688) {
        operator_delete(local_698,local_688 + 1);
      }
      if (local_6b8 != &local_6a8) {
        operator_delete(local_6b8,local_6a8 + 1);
      }
      if (local_740 != &local_730) {
        operator_delete(local_740,local_730 + 1);
      }
      if (local_700[0] != local_6f0) {
        operator_delete(local_700[0],local_6f0[0] + 1);
      }
      if (local_760[0] != local_750) {
        operator_delete(local_760[0],local_750[0] + 1);
      }
      if (local_6e0[0] != local_6d0) {
        operator_delete(local_6e0[0],local_6d0[0] + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Running dot with following command:\n",0x24);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_5d8,(long)local_5d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      iVar3 = system((char *)local_5d8);
      if (iVar3 == 0) {
        local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"dot-stdout","");
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,&local_7c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
          operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
        }
        iVar3 = 0;
        if (cVar8._M_node != &local_b8) {
          poVar9 = operator<<((ostream *)&std::cout,&local_2d8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error when running dot!",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        iVar3 = 1;
        std::ostream::flush();
      }
      if (local_5d8 != (undefined1  [8])local_5c8) {
        operator_delete((void *)local_5d8,local_5c8[0]._M_allocated_capacity + 1);
      }
      if (local_720[0] != local_710) {
        operator_delete(local_720[0],local_710[0] + 1);
      }
      if (local_7a0 != local_790) {
        operator_delete(local_7a0,local_790[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2d8.general_options);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8.name._M_dataplus._M_p != &local_2d8.name.field_2) {
        operator_delete(local_2d8.name._M_dataplus._M_p,
                        local_2d8.name.field_2._M_allocated_capacity + 1);
      }
      std::vector<transition,_std::allocator<transition>_>::~vector(&local_2d8.transitions);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780.m_pathname._M_dataplus._M_p != &local_780.m_pathname.field_2) {
        operator_delete(local_780.m_pathname._M_dataplus._M_p,
                        local_780.m_pathname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001067cc;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"fsm2dot version 1.0",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
  }
  else {
    poVar9 = (ostream *)
             boost::program_options::operator<<
                       ((ostream *)&std::cout,(options_description *)&local_3d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  }
  iVar3 = 0;
LAB_001067cc:
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_370);
  if (local_398 != (void *)0x0) {
    operator_delete(local_398,local_378 - (long)local_398);
    local_398 = (void *)0x0;
    local_390 = 0;
    local_388 = 0;
    local_380 = 0;
    local_378 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_220);
  if (local_248 != (void *)0x0) {
    operator_delete(local_248,local_228 - (long)local_248);
    local_248 = (void *)0x0;
    local_240 = 0;
    local_238 = 0;
    local_230 = 0;
    local_228 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_2f0);
  if (local_318 != (void *)0x0) {
    operator_delete(local_318,local_2f8 - (long)local_318);
    local_318 = (void *)0x0;
    local_310 = 0;
    local_308 = 0;
    local_300 = 0;
    local_2f8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_330);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_5f0);
  if (local_618 != (void *)0x0) {
    operator_delete(local_618,local_5f8 - (long)local_618);
    local_618 = (void *)0x0;
    local_610 = 0;
    local_608 = 0;
    local_600 = 0;
    local_5f8 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_630);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_168);
  if (local_190 != (void *)0x0) {
    operator_delete(local_190,local_170 - (long)local_190);
    local_190 = (void *)0x0;
    local_188 = 0;
    local_180 = 0;
    local_178 = 0;
    local_170 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_1a8);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_e8);
  if (local_110 != (void *)0x0) {
    operator_delete(local_110,local_f0 - (long)local_110);
    local_110 = (void *)0x0;
    local_108 = 0;
    local_100 = 0;
    local_f8 = 0;
    local_f0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_128);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  if (local_678 != &local_668) {
    operator_delete(local_678,CONCAT71(uStack_667,local_668) + 1);
  }
  local_d0[0] = __cxa_throw;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_c0);
  return iVar3;
}

Assistant:

int main(int argc, const char *argv[])
{
    po::variables_map vm;
    using namespace std;

    std::string file_data;

    try {
        // Declare a group of options that will be allowed only on command line
        po::options_description basic("Basic options");
        basic.add_options()
                ("version,v",   "print version string")
                ("help,h",      "produce help message")
                ;

        // Declare a group of options that will be
        // allowed both on command line and in config file
        po::options_description config("Configuration");
        config.add_options()
                ("file,f", po::value<std::string>()->default_value(""), "C++ file with state machine definition")
                ("dot-stdout", "Write dot file also to stdout")
                ("dot-path,dot", po::value<std::string>()->default_value("dot"), "Full path (or name if in PATH) of the dot executable")
                ("output-dir,dir", po::value<std::string>()->default_value(""), "Output directory for dot and image file")
                ("output,o", po::value<std::string>()->default_value(""), "Output file name(s) for .dot file and image file")
                ("image-ext,ext", po::value<std::string>()->default_value("png"), "Image extension")
                ;

        // Hidden options, will be allowed both on command line and
        // in config file, but will not be shown to the user.
        // Hidden options are those without argument names (unanmed arguments).
        // In this case we use them for the php script to execute along
        // with the command line parameters for this script.
        po::options_description hidden("Hidden options");
        hidden.add_options()
                ("dot-params", po::value< std::vector<std::string> >(), "(Graphviz) dot parameters")
                ;


        po::options_description cmdline_options;
        cmdline_options.add(basic).add(config).add(hidden);

        po::options_description config_file_options;
        config_file_options.add(config).add(hidden);

        po::options_description visible("Allowed options");
        visible.add(basic).add(config);

        po::positional_options_description p;
        p.add("dot-params", -1);

        po::store(po::command_line_parser(argc, argv).options(cmdline_options).positional(p).run(), vm);
        po::notify(vm);

        notify(vm);

        if (vm.count("help")) {
            std::cout << visible << "\n";
            return 0;
        }

        if (vm.count("version")) {
            std::cout << "fsm2dot version 1.0" << std::endl;
            return 0;
        }

        // PHP miner script and parameters for this
        if (vm.count("dot-params")) {
        }

        auto input_file_path = boost::filesystem::path(vm["file"].as<std::string >());
        {
            fsm_def sm = fsm_from_file(input_file_path);

            const auto dot_file_path   = input_file_path.replace_extension("gv");
            const auto image_file_path = input_file_path.replace_extension(vm["image-ext"].as<std::string >());
            {
                std::cout << "Writing dot file to: '" << dot_file_path.native() << "'" << std::endl;
                std::ofstream os(dot_file_path.native());
                os << sm << std::endl;
            }
            std::string dot_cmd = vm["dot-path"].as<std::string >()
                    + " -T" + vm["image-ext"].as<std::string >()
                    + " " + dot_file_path.native()
                    + " -o " + image_file_path.native();

            std::cout << "Running dot with following command:\n" << dot_cmd << std::endl;
            // dot -Tpng fsm.gv -o myFiniteStateMachine.png

            if (std::system(dot_cmd.c_str()) != 0) {
                std::cout << "Error when running dot!" << std::endl;
                return 1;
            }
            if (vm.count("dot-stdout")) {
                std::cout << sm << std::endl;
            }
        }

    }
    catch(std::exception& e)
    {
        std::cout << "Error: Unknown arguments given:" << std::endl;
        std::cout << e.what() << "\n";
        return 1;
    }
    return 0;
}